

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Character.hpp
# Opt level: O2

void njoy::tools::disco::Character<66u>::
     write<std::__cxx11::string,std::back_insert_iterator<std::__cxx11::string>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *iter)

{
  ulong uVar1;
  value_type *__value;
  uint uVar2;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  uVar1 = value->_M_string_length;
  for (uVar2 = 0; (uVar1 < 0x42 && (uVar2 < 0x42U - (int)uVar1)); uVar2 = uVar2 + 1) {
    std::__cxx11::string::push_back((char)iter->container);
  }
  __value = (value->_M_dataplus)._M_p;
  for (; uVar2 < 0x42; uVar2 = uVar2 + 1) {
    local_38 = (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )iter->container;
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&local_38,__value);
    __value = __value + 1;
  }
  return;
}

Assistant:

static void write( const Representation& value, Iterator& iter ) {

    unsigned int position = 0;
    const unsigned int difference = value.size() >= Width ? 0 : Width - value.size();
    while ( position < difference ) {

      ++position;
      *iter++ = ' ';
    }
    auto viter = value.begin();
    while ( position < Width ) {

      ++position;
      *iter++ = *viter++;
    }
  }